

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  uchar *puVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  
  puVar4 = data;
  if (req_comp != img_n) {
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        iVar10 = req_comp + img_n * 8;
        iVar1 = x - 1;
        uVar12 = 0;
        auVar14[8] = 0xff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14[9] = 0xff;
        auVar14[10] = 0xff;
        auVar14[0xb] = 0xff;
        auVar14[0xc] = 0xff;
        auVar14[0xd] = 0xff;
        auVar14[0xe] = 0xff;
        auVar14[0xf] = 0xff;
        uVar13 = 0;
        uVar6 = 0;
        do {
          if (iVar10 - 10U < 0x1a) {
            iVar7 = (int)uVar6 * x;
            pbVar11 = data + (uint)(iVar7 * img_n);
            pbVar8 = puVar4 + (uint)(iVar7 * req_comp);
            switch(iVar10) {
            case 10:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar5 = x;
                do {
                  puVar4[lVar9 * 2 + uVar13] = data[lVar9 + uVar12];
                  puVar4[lVar9 * 2 + uVar13 + 1] = 0xff;
                  uVar5 = uVar5 - 1;
                  lVar9 = lVar9 + 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                pbVar8 = puVar4 + uVar13 + 2;
                uVar5 = x;
                do {
                  bVar2 = *pbVar11;
                  *pbVar8 = bVar2;
                  pbVar8[-1] = bVar2;
                  pbVar8[-2] = bVar2;
                  pbVar11 = pbVar11 + 1;
                  uVar5 = uVar5 - 1;
                  pbVar8 = pbVar8 + 3;
                } while (0 < (int)uVar5);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar5 = x;
                do {
                  auVar3 = vpinsrb_avx(auVar14,(uint)data[lVar9 + uVar12],0);
                  auVar3 = vpshufb_avx(auVar3,SUB6416(ZEXT464(0x1000000),0));
                  *(int *)(puVar4 + lVar9 * 4 + uVar13) = auVar3._0_4_;
                  uVar5 = uVar5 - 1;
                  lVar9 = lVar9 + 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x11:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar5 = x;
                do {
                  puVar4[lVar9 + uVar13] = data[lVar9 * 2 + uVar12];
                  uVar5 = uVar5 - 1;
                  lVar9 = lVar9 + 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                pbVar8 = puVar4 + uVar13 + 2;
                uVar5 = x;
                do {
                  bVar2 = *pbVar11;
                  *pbVar8 = bVar2;
                  pbVar8[-1] = bVar2;
                  pbVar8[-2] = bVar2;
                  pbVar11 = pbVar11 + 2;
                  uVar5 = uVar5 - 1;
                  pbVar8 = pbVar8 + 3;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar5 = x;
                do {
                  auVar3 = vpshufb_avx(ZEXT216(*(ushort *)(data + lVar9 + uVar12)),
                                       SUB6416(ZEXT464(0x1000000),0));
                  *(int *)(puVar4 + lVar9 * 2 + uVar13) = auVar3._0_4_;
                  uVar5 = uVar5 - 1;
                  lVar9 = lVar9 + 2;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x19:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar11[2];
                  *pbVar8 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar11[1] * 0x96 + (uint)*pbVar11 * 0x4d >> 8);
                  pbVar11 = pbVar11 + 3;
                  pbVar8 = pbVar8 + 1;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x1a:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar11[2];
                  *pbVar8 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar11[1] * 0x96 + (uint)*pbVar11 * 0x4d >> 8);
                  pbVar8[1] = 0xff;
                  pbVar11 = pbVar11 + 3;
                  pbVar8 = pbVar8 + 2;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x1c:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar8 = *pbVar11;
                  pbVar8[1] = pbVar11[1];
                  pbVar8[2] = pbVar11[2];
                  pbVar8[3] = 0xff;
                  pbVar11 = pbVar11 + 3;
                  pbVar8 = pbVar8 + 4;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar5 = x;
                do {
                  bVar2 = data[lVar9 * 4 + uVar12 + 2];
                  puVar4[lVar9 + uVar13] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar9 * 4 + uVar12 + 1] * 0x96 +
                               (uint)data[lVar9 * 4 + uVar12] * 0x4d >> 8);
                  uVar5 = uVar5 - 1;
                  lVar9 = lVar9 + 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar5 = x;
                do {
                  bVar2 = data[lVar9 * 2 + uVar12 + 2];
                  puVar4[lVar9 + uVar13] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar9 * 2 + uVar12 + 1] * 0x96 +
                               (uint)data[lVar9 * 2 + uVar12] * 0x4d >> 8);
                  puVar4[lVar9 + uVar13 + 1] = data[lVar9 * 2 + uVar12 + 3];
                  uVar5 = uVar5 - 1;
                  lVar9 = lVar9 + 2;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x23:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar8 = *pbVar11;
                  pbVar8[1] = pbVar11[1];
                  pbVar8[2] = pbVar11[2];
                  pbVar11 = pbVar11 + 4;
                  pbVar8 = pbVar8 + 3;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
            }
          }
          uVar6 = uVar6 + 1;
          uVar13 = (ulong)((int)uVar13 + x * req_comp);
          uVar12 = (ulong)((int)uVar12 + x * img_n);
        } while (uVar6 != y);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0], dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0], dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0], dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0],dest[1]=src[1],dest[2]=src[2],dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]), dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0],dest[1]=src[1],dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}